

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodea.c
# Opt level: O0

int CVApolynomialGetY(CVodeMem cv_mem,sunrealtype t,N_Vector y,N_Vector *yS)

{
  int iVar1;
  long in_RDX;
  undefined8 in_RSI;
  CVodeMem in_RDI;
  sunrealtype in_XMM0_Qa;
  double dVar2;
  double dVar3;
  sunrealtype factor;
  sunrealtype dt;
  int newpoint;
  long base;
  long indx;
  int retval;
  int NS;
  int is;
  int j;
  int i;
  int order;
  int dir;
  int flag;
  CVpolynomialDataMem content;
  CVdtpntMem *dt_mem;
  CVadjMem ca_mem;
  int local_8c;
  int local_74;
  long local_70;
  long local_68;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  undefined8 *local_40;
  CVdtpntMemRec **local_38;
  CVadjMemRec *local_30;
  long local_28;
  undefined8 local_20;
  sunrealtype local_18;
  CVodeMem local_10;
  int local_4;
  
  local_30 = in_RDI->cv_adj_mem;
  local_38 = local_30->dt_mem;
  if ((local_30->ca_IMinterpSensi == 0) || (in_RDX == 0)) {
    local_8c = 0;
  }
  else {
    local_8c = in_RDI->cv_Ns;
  }
  local_5c = local_8c;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_XMM0_Qa;
  local_10 = in_RDI;
  local_44 = CVAfindIndex(in_RDI,in_XMM0_Qa,&local_68,&local_74);
  local_4 = local_44;
  if (local_44 == 0) {
    if (local_68 == 0) {
      local_40 = (undefined8 *)(*local_38)->content;
      N_VScale(0x3ff0000000000000,*local_40,local_20);
      if (0 < local_5c) {
        for (local_58 = 0; local_58 < local_5c; local_58 = local_58 + 1) {
          local_10->cv_cvals[local_58] = 1.0;
        }
        iVar1 = N_VScaleVectorArray(local_5c,local_10->cv_cvals,local_40[1],local_28);
        if (iVar1 != 0) {
          return -0x1c;
        }
      }
      local_4 = 0;
    }
    else {
      dVar2 = ABS(local_38[local_68]->t - local_38[local_68 + -1]->t);
      local_48 = -1;
      if (0.0 < local_30->ca_tfinal - local_30->ca_tinitial) {
        local_48 = 1;
      }
      if (local_48 == 1) {
        local_70 = local_68;
        local_40 = (undefined8 *)local_38[local_68]->content;
        local_4c = *(int *)(local_40 + 2);
        if (local_68 < local_4c) {
          local_70 = (long)local_4c;
        }
      }
      else {
        local_70 = local_68 + -1;
        local_40 = (undefined8 *)local_38[local_70]->content;
        local_4c = *(int *)(local_40 + 2);
        if ((long)local_4c < local_30->ca_np - local_68) {
          local_70 = local_70 - ((local_68 + local_4c) - local_30->ca_np);
        }
      }
      local_44 = 0;
      if (local_74 != 0) {
        if (local_48 == 1) {
          for (local_54 = 0; local_54 <= local_4c; local_54 = local_54 + 1) {
            local_30->ca_T[local_54] = local_38[local_70 - local_54]->t;
            local_40 = (undefined8 *)local_38[local_70 - local_54]->content;
            N_VScale(0x3ff0000000000000,*local_40,local_30->ca_Y[local_54]);
            if (0 < local_5c) {
              for (local_58 = 0; local_58 < local_5c; local_58 = local_58 + 1) {
                local_10->cv_cvals[local_58] = 1.0;
              }
              iVar1 = N_VScaleVectorArray(local_5c,local_10->cv_cvals,local_40[1],
                                          local_30->ca_YS[local_54]);
              if (iVar1 != 0) {
                return -0x1c;
              }
              local_60 = 0;
            }
          }
        }
        else {
          for (local_54 = 0; local_54 <= local_4c; local_54 = local_54 + 1) {
            local_30->ca_T[local_54] = local_38[local_70 + -1 + (long)local_54]->t;
            local_40 = (undefined8 *)local_38[local_70 + -1 + (long)local_54]->content;
            N_VScale(0x3ff0000000000000,*local_40,local_30->ca_Y[local_54]);
            if (0 < local_5c) {
              for (local_58 = 0; local_58 < local_5c; local_58 = local_58 + 1) {
                local_10->cv_cvals[local_58] = 1.0;
              }
              iVar1 = N_VScaleVectorArray(local_5c,local_10->cv_cvals,local_40[1],
                                          local_30->ca_YS[local_54]);
              if (iVar1 != 0) {
                return -0x1c;
              }
              local_60 = 0;
            }
          }
        }
        for (local_50 = 1; local_50 <= local_4c; local_50 = local_50 + 1) {
          for (local_54 = local_4c; local_50 <= local_54; local_54 = local_54 + -1) {
            dVar3 = dVar2 / (local_30->ca_T[local_54] - local_30->ca_T[local_54 - local_50]);
            N_VLinearSum(dVar3,-dVar3,local_30->ca_Y[local_54],local_30->ca_Y[local_54 + -1],
                         local_30->ca_Y[local_54]);
            if (0 < local_5c) {
              iVar1 = N_VLinearSumVectorArray
                                (dVar3,-dVar3,local_5c,local_30->ca_YS[local_54],
                                 local_30->ca_YS[local_54 + -1],local_30->ca_YS[local_54]);
              if (iVar1 != 0) {
                return -0x1c;
              }
              local_60 = 0;
            }
          }
        }
      }
      *local_10->cv_cvals = 1.0;
      for (local_50 = 0; local_50 < local_4c; local_50 = local_50 + 1) {
        local_10->cv_cvals[local_50 + 1] =
             (local_10->cv_cvals[local_50] * (local_18 - local_30->ca_T[local_50])) / dVar2;
      }
      local_60 = N_VLinearCombination(local_4c + 1,local_10->cv_cvals,local_30->ca_Y,local_20);
      if (local_60 == 0) {
        if ((local_5c < 1) ||
           (iVar1 = N_VLinearCombinationVectorArray
                              (local_5c,local_4c + 1,local_10->cv_cvals,local_30->ca_YS,local_28),
           iVar1 == 0)) {
          local_4 = 0;
        }
        else {
          local_4 = -0x1c;
        }
      }
      else {
        local_4 = -0x1c;
      }
    }
  }
  return local_4;
}

Assistant:

static int CVApolynomialGetY(CVodeMem cv_mem, sunrealtype t, N_Vector y,
                             N_Vector* yS)
{
  CVadjMem ca_mem;
  CVdtpntMem* dt_mem;
  CVpolynomialDataMem content;

  int flag, dir, order, i, j, is, NS, retval;
  long int indx, base;
  sunbooleantype newpoint;
  sunrealtype dt, factor;

  ca_mem = cv_mem->cv_adj_mem;
  dt_mem = ca_mem->dt_mem;

  /* Local value of Ns */

  NS = (ca_mem->ca_IMinterpSensi && (yS != NULL)) ? cv_mem->cv_Ns : 0;

  /* Get the index in dt_mem */

  flag = CVAfindIndex(cv_mem, t, &indx, &newpoint);
  if (flag != CV_SUCCESS) { return (flag); }

  /* If we are beyond the left limit but close enough,
     then return y at the left limit. */

  if (indx == 0)
  {
    content = (CVpolynomialDataMem)(dt_mem[0]->content);
    N_VScale(ONE, content->y, y);

    if (NS > 0)
    {
      for (is = 0; is < NS; is++) { cv_mem->cv_cvals[is] = ONE; }
      retval = N_VScaleVectorArray(NS, cv_mem->cv_cvals, content->yS, yS);
      if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }
    }

    return (CV_SUCCESS);
  }

  /* Scaling factor */

  dt = SUNRabs(dt_mem[indx]->t - dt_mem[indx - 1]->t);

  /* Find the direction of the forward integration */

  dir = (ca_mem->ca_tfinal - ca_mem->ca_tinitial > ZERO) ? 1 : -1;

  /* Establish the base point depending on the integration direction.
     Modify the base if there are not enough points for the current order */

  if (dir == 1)
  {
    base    = indx;
    content = (CVpolynomialDataMem)(dt_mem[base]->content);
    order   = content->order;
    if (indx < order) { base += order - indx; }
  }
  else
  {
    base    = indx - 1;
    content = (CVpolynomialDataMem)(dt_mem[base]->content);
    order   = content->order;
    if (ca_mem->ca_np - indx > order) { base -= indx + order - ca_mem->ca_np; }
  }

  /* Recompute Y (divided differences for Newton polynomial) if needed */

  if (newpoint)
  {
    /* Store 0-th order DD */
    if (dir == 1)
    {
      for (j = 0; j <= order; j++)
      {
        ca_mem->ca_T[j] = dt_mem[base - j]->t;
        content         = (CVpolynomialDataMem)(dt_mem[base - j]->content);
        N_VScale(ONE, content->y, ca_mem->ca_Y[j]);

        if (NS > 0)
        {
          for (is = 0; is < NS; is++) { cv_mem->cv_cvals[is] = ONE; }
          retval = N_VScaleVectorArray(NS, cv_mem->cv_cvals, content->yS,
                                       ca_mem->ca_YS[j]);
          if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }
        }
      }
    }
    else
    {
      for (j = 0; j <= order; j++)
      {
        ca_mem->ca_T[j] = dt_mem[base - 1 + j]->t;
        content         = (CVpolynomialDataMem)(dt_mem[base - 1 + j]->content);
        N_VScale(ONE, content->y, ca_mem->ca_Y[j]);
        if (NS > 0)
        {
          for (is = 0; is < NS; is++) { cv_mem->cv_cvals[is] = ONE; }
          retval = N_VScaleVectorArray(NS, cv_mem->cv_cvals, content->yS,
                                       ca_mem->ca_YS[j]);
          if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }
        }
      }
    }

    /* Compute higher-order DD */
    for (i = 1; i <= order; i++)
    {
      for (j = order; j >= i; j--)
      {
        factor = dt / (ca_mem->ca_T[j] - ca_mem->ca_T[j - i]);
        N_VLinearSum(factor, ca_mem->ca_Y[j], -factor, ca_mem->ca_Y[j - 1],
                     ca_mem->ca_Y[j]);

        if (NS > 0)
        {
          retval = N_VLinearSumVectorArray(NS, factor, ca_mem->ca_YS[j],
                                           -factor, ca_mem->ca_YS[j - 1],
                                           ca_mem->ca_YS[j]);
          if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }
        }
      }
    }
  }

  /* Perform the actual interpolation using nested multiplications */

  cv_mem->cv_cvals[0] = ONE;
  for (i = 0; i < order; i++)
  {
    cv_mem->cv_cvals[i + 1] = cv_mem->cv_cvals[i] * (t - ca_mem->ca_T[i]) / dt;
  }

  retval = N_VLinearCombination(order + 1, cv_mem->cv_cvals, ca_mem->ca_Y, y);
  if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }

  if (NS > 0)
  {
    retval = N_VLinearCombinationVectorArray(NS, order + 1, cv_mem->cv_cvals,
                                             ca_mem->ca_YS, yS);
    if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }
  }

  return (CV_SUCCESS);
}